

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::EquationsToDecompose
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZVec<long> *destinationindex,int64_t *lower_eq,int64_t *upper_eq)

{
  int64_t iVar1;
  long *plVar2;
  int *piVar3;
  long *in_RCX;
  long *in_RDX;
  TPZVec<long> *in_RSI;
  long in_RDI;
  bool bVar4;
  int64_t global;
  int64_t loop_limit;
  int64_t i;
  undefined8 local_28;
  
  iVar1 = TPZVec<long>::NElements(in_RSI);
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    plVar2 = TPZVec<long>::operator[](in_RSI,local_28);
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x1fb20),*plVar2);
    *piVar3 = *piVar3 + -1;
  }
  *in_RCX = *(long *)(in_RDI + 0x1fb18);
  *in_RDX = *(long *)(in_RDI + 0x1fb18) + 1;
  while( true ) {
    bVar4 = false;
    if (*in_RCX < *(long *)(in_RDI + 0x1fb10) + -1) {
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x1fb20),*in_RCX + 1);
      bVar4 = *piVar3 == 0;
    }
    if (!bVar4) break;
    *in_RCX = *in_RCX + 1;
  }
  *(long *)(in_RDI + 0x1fb18) = *in_RCX;
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::EquationsToDecompose(TPZVec<int64_t> &destinationindex, int64_t &lower_eq, int64_t &upper_eq)
{
	int64_t i;
	int64_t loop_limit, global;
	loop_limit = destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		global = destinationindex[i];
		fNumElConnected[global]--;
	}
	upper_eq=fLastDecomposed;
	lower_eq=fLastDecomposed+1;
	while(upper_eq < fNumEq-1 && fNumElConnected[upper_eq+1]==0) upper_eq++;
	fLastDecomposed=upper_eq;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Constructor frontmatrix lower_eq "<< lower_eq << " upper_eq " << upper_eq << " fNumElConnected " << fNumElConnected;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}